

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

node_type * __thiscall
Tree<NULLC::Range>::insert(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  bool bVar1;
  int iVar2;
  int y;
  node_type *pnVar3;
  int balance;
  node_type *t;
  Range *key_local;
  node_type *node_local;
  Tree<NULLC::Range> *this_local;
  
  if (node == (node_type *)0x0) {
    this_local = (Tree<NULLC::Range> *)
                 TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate(&this->pool);
    (((node<NULLC::Range> *)this_local)->key).start = key->start;
    (((node<NULLC::Range> *)this_local)->key).end = key->end;
  }
  else {
    bVar1 = NULLC::Range::operator<(key,&node->key);
    if (bVar1) {
      pnVar3 = insert(this,node->left,key);
      node->left = pnVar3;
    }
    else {
      pnVar3 = insert(this,node->right,key);
      node->right = pnVar3;
    }
    iVar2 = get_height(this,node->left);
    y = get_height(this,node->right);
    iVar2 = detail::max<int>(iVar2,y);
    node->height = iVar2 + 1;
    iVar2 = get_balance(this,node);
    if ((iVar2 < 2) || (bVar1 = NULLC::Range::operator<(key,&node->left->key), !bVar1)) {
      if ((iVar2 < -1) && (bVar1 = NULLC::Range::operator>(key,&node->right->key), bVar1)) {
        this_local = (Tree<NULLC::Range> *)left_rotate(this,node);
      }
      else if ((iVar2 < 2) || (bVar1 = NULLC::Range::operator>(key,&node->left->key), !bVar1)) {
        this_local = (Tree<NULLC::Range> *)node;
        if ((iVar2 < -1) && (bVar1 = NULLC::Range::operator<(key,&node->right->key), bVar1)) {
          pnVar3 = right_rotate(this,node->right);
          node->right = pnVar3;
          this_local = (Tree<NULLC::Range> *)left_rotate(this,node);
        }
      }
      else {
        pnVar3 = left_rotate(this,node->left);
        node->left = pnVar3;
        this_local = (Tree<NULLC::Range> *)right_rotate(this,node);
      }
    }
    else {
      this_local = (Tree<NULLC::Range> *)right_rotate(this,node);
    }
  }
  return (node_type *)this_local;
}

Assistant:

node_type* insert(node_type* node, const T& key)
	{
		if(node == NULL)
		{
			node_type *t = pool.Allocate();
			t->key = key;
			return t;
		}

		if(key < node->key)
			node->left = insert(node->left, key);
		else
			node->right = insert(node->right, key);

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && key < node->left->key)
			return right_rotate(node);

		if(balance < -1 && key > node->right->key)
			return left_rotate(node);

		if(balance > 1 && key > node->left->key)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && key < node->right->key)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}